

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFFormValue.cpp
# Opt level: O0

bool llvm::DWARFFormValue::skipValue
               (Form Form,DataExtractor DebugInfoData,uint64_t *OffsetPtr,FormParams Params)

{
  byte bVar1;
  bool bVar2;
  uint16_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  byte *pbVar7;
  OptionalStorage<unsigned_char,_true> local_32 [4];
  Optional<unsigned_char> FixedSize;
  uint32_t size_3;
  uint16_t size_2;
  uint8_t size_1;
  uint64_t size;
  bool Indirect;
  uint64_t *OffsetPtr_local;
  Form Form_local;
  FormParams Params_local;
  
  OffsetPtr_local._0_2_ = Form;
LAB_028244f2:
  uVar4 = (uint)(Form)OffsetPtr_local;
  if (uVar4 == 1) {
LAB_02824742:
    local_32[0] = (OptionalStorage<unsigned_char,_true>)
                  dwarf::getFixedFormByteSize((Form)OffsetPtr_local,Params);
    bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)local_32);
    if (bVar2) {
      pbVar7 = Optional<unsigned_char>::operator*((Optional<unsigned_char> *)local_32);
      *OffsetPtr = (ulong)*pbVar7 + *OffsetPtr;
    }
    return bVar2;
  }
  if (uVar4 == 3) {
    uVar3 = DataExtractor::getU16(&DebugInfoData,OffsetPtr,(Error *)0x0);
    *OffsetPtr = (ulong)uVar3 + *OffsetPtr;
    return true;
  }
  if (uVar4 == 4) {
    uVar5 = DataExtractor::getU32(&DebugInfoData,OffsetPtr,(Error *)0x0);
    *OffsetPtr = (ulong)uVar5 + *OffsetPtr;
    return true;
  }
  if (uVar4 - 5 < 3) goto LAB_02824742;
  if (uVar4 == 8) {
    DataExtractor::getCStr(&DebugInfoData,OffsetPtr);
    return true;
  }
  if (uVar4 == 9) {
LAB_02824679:
    uVar6 = DataExtractor::getULEB128(&DebugInfoData,OffsetPtr,(Error *)0x0);
    *OffsetPtr = uVar6 + *OffsetPtr;
    return true;
  }
  if (uVar4 == 10) {
    bVar1 = DataExtractor::getU8(&DebugInfoData,OffsetPtr,(Error *)0x0);
    *OffsetPtr = (ulong)bVar1 + *OffsetPtr;
    return true;
  }
  if (uVar4 - 0xb < 2) goto LAB_02824742;
  if (uVar4 == 0xd) {
    DataExtractor::getSLEB128(&DebugInfoData,OffsetPtr);
    return true;
  }
  if (uVar4 == 0xe) goto LAB_02824742;
  if (uVar4 != 0xf) {
    if (uVar4 - 0x10 < 5) goto LAB_02824742;
    if (uVar4 == 0x15) goto LAB_028247a1;
    if (uVar4 == 0x16) {
      uVar6 = DataExtractor::getULEB128(&DebugInfoData,OffsetPtr,(Error *)0x0);
      OffsetPtr_local._0_2_ = (Form)uVar6;
      goto LAB_028244f2;
    }
    if (uVar4 == 0x17) goto LAB_02824742;
    if (uVar4 == 0x18) goto LAB_02824679;
    if (uVar4 == 0x19) goto LAB_02824742;
    if (1 < uVar4 - 0x1a) {
      if (uVar4 - 0x1c < 5) goto LAB_02824742;
      if (uVar4 - 0x22 < 2) goto LAB_028247a1;
      if (((uVar4 - 0x24 < 3) || (uVar4 - 0x28 < 3)) || (uVar4 == 0x2c)) goto LAB_02824742;
      if (1 < uVar4 - 0x1f01) {
        if (1 < uVar4 - 0x1f20) {
          return false;
        }
        goto LAB_02824742;
      }
    }
  }
LAB_028247a1:
  DataExtractor::getULEB128(&DebugInfoData,OffsetPtr,(Error *)0x0);
  return true;
}

Assistant:

bool DWARFFormValue::skipValue(dwarf::Form Form, DataExtractor DebugInfoData,
                               uint64_t *OffsetPtr,
                               const dwarf::FormParams Params) {
  bool Indirect = false;
  do {
    switch (Form) {
    // Blocks of inlined data that have a length field and the data bytes
    // inlined in the .debug_info.
    case DW_FORM_exprloc:
    case DW_FORM_block: {
      uint64_t size = DebugInfoData.getULEB128(OffsetPtr);
      *OffsetPtr += size;
      return true;
    }
    case DW_FORM_block1: {
      uint8_t size = DebugInfoData.getU8(OffsetPtr);
      *OffsetPtr += size;
      return true;
    }
    case DW_FORM_block2: {
      uint16_t size = DebugInfoData.getU16(OffsetPtr);
      *OffsetPtr += size;
      return true;
    }
    case DW_FORM_block4: {
      uint32_t size = DebugInfoData.getU32(OffsetPtr);
      *OffsetPtr += size;
      return true;
    }

    // Inlined NULL terminated C-strings.
    case DW_FORM_string:
      DebugInfoData.getCStr(OffsetPtr);
      return true;

    case DW_FORM_addr:
    case DW_FORM_ref_addr:
    case DW_FORM_flag_present:
    case DW_FORM_data1:
    case DW_FORM_data2:
    case DW_FORM_data4:
    case DW_FORM_data8:
    case DW_FORM_data16:
    case DW_FORM_flag:
    case DW_FORM_ref1:
    case DW_FORM_ref2:
    case DW_FORM_ref4:
    case DW_FORM_ref8:
    case DW_FORM_ref_sig8:
    case DW_FORM_ref_sup4:
    case DW_FORM_ref_sup8:
    case DW_FORM_strx1:
    case DW_FORM_strx2:
    case DW_FORM_strx4:
    case DW_FORM_addrx1:
    case DW_FORM_addrx2:
    case DW_FORM_addrx4:
    case DW_FORM_sec_offset:
    case DW_FORM_strp:
    case DW_FORM_strp_sup:
    case DW_FORM_line_strp:
    case DW_FORM_GNU_ref_alt:
    case DW_FORM_GNU_strp_alt:
      if (Optional<uint8_t> FixedSize =
              dwarf::getFixedFormByteSize(Form, Params)) {
        *OffsetPtr += *FixedSize;
        return true;
      }
      return false;

    // signed or unsigned LEB 128 values.
    case DW_FORM_sdata:
      DebugInfoData.getSLEB128(OffsetPtr);
      return true;

    case DW_FORM_udata:
    case DW_FORM_ref_udata:
    case DW_FORM_strx:
    case DW_FORM_addrx:
    case DW_FORM_loclistx:
    case DW_FORM_rnglistx:
    case DW_FORM_GNU_addr_index:
    case DW_FORM_GNU_str_index:
      DebugInfoData.getULEB128(OffsetPtr);
      return true;

    case DW_FORM_indirect:
      Indirect = true;
      Form = static_cast<dwarf::Form>(DebugInfoData.getULEB128(OffsetPtr));
      break;

    default:
      return false;
    }
  } while (Indirect);
  return true;
}